

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
google::protobuf::Arena::Create<std::__cxx11::string,std::__cxx11::string>
          (Arena *arena,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar5;
  
  if (arena == (Arena *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
  }
  else {
    pVar5 = AllocateAlignedWithCleanup(arena,0x20,(type_info *)&std::__cxx11::string::typeinfo);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVar5.first;
    (pVar5.second)->elem = pbVar4;
    (pVar5.second)->cleanup = internal::arena_destruct_object<std::__cxx11::string>;
  }
  (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
  pcVar2 = (args->_M_dataplus)._M_p;
  paVar1 = &args->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&args->field_2 + 8);
    (pbVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&pbVar4->field_2 + 8) = uVar3;
  }
  else {
    (pbVar4->_M_dataplus)._M_p = pcVar2;
    (pbVar4->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  pbVar4->_M_string_length = args->_M_string_length;
  (args->_M_dataplus)._M_p = (pointer)paVar1;
  args->_M_string_length = 0;
  (args->field_2)._M_local_buf[0] = '\0';
  return pbVar4;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* Create(Arena* arena, Args&&... args) {
    return CreateInternal<T>(arena, std::is_convertible<T*, MessageLite*>(),
                             static_cast<Args&&>(args)...);
  }